

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::ArrayPtr<char_const>,kj::ArrayPtr<char>,kj::StringPtr>
          (String *__return_storage_ptr__,kj *this,ArrayPtr<const_char> *params,
          ArrayPtr<char> *params_1,StringPtr *params_2)

{
  ArrayPtr<const_char> local_38;
  ArrayPtr<const_char> local_28;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = *(undefined8 *)this;
  uStack_10 = *(undefined8 *)(this + 8);
  local_28.ptr = params->ptr;
  local_28.size_ = params->size_;
  local_38.ptr = params_1->ptr;
  local_38.size_ = params_1->size_ - 1;
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_18,&local_28,&local_38,&params_2->content);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}